

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.cpp
# Opt level: O2

string_t duckdb::BarScalarFunction(double x,double min,double max,double max_width,string *result)

{
  bool bVar1;
  int iVar2;
  OutOfRangeException *pOVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  allocator local_81;
  double local_80;
  double local_78;
  string local_68;
  double local_48;
  double local_40;
  anon_union_16_2_67f50693_for_value local_38;
  
  local_80 = x;
  local_78 = max_width;
  local_48 = max;
  local_40 = min;
  if (BarScalarFunction(double,double,double,double,std::__cxx11::string&)::FULL_BLOCK == '\0') {
    iVar2 = __cxa_guard_acquire(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)
                                 ::FULL_BLOCK);
    if (iVar2 != 0) {
      BarScalarFunction::FULL_BLOCK = anon_var_dwarf_1a43186;
      __cxa_guard_release(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)::
                           FULL_BLOCK);
    }
  }
  if (BarScalarFunction(double,double,double,double,std::__cxx11::string&)::PARTIAL_BLOCKS == '\0')
  {
    iVar2 = __cxa_guard_acquire(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)
                                 ::PARTIAL_BLOCKS);
    if (iVar2 != 0) {
      BarScalarFunction::PARTIAL_BLOCKS = (char **)UnicodeBar::PartialBlocks()::PARTIAL_BLOCKS;
      __cxa_guard_release(&BarScalarFunction(double,double,double,double,std::__cxx11::string&)::
                           PARTIAL_BLOCKS);
    }
  }
  bVar1 = Value::IsFinite<double>(local_78);
  if (!bVar1) {
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_68,"Max bar width must not be NaN or infinity",&local_81);
    OutOfRangeException::OutOfRangeException(pOVar3,&local_68);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_78 < 1.0) {
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_68,"Max bar width must be >= 1",&local_81);
    OutOfRangeException::OutOfRangeException(pOVar3,&local_68);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_78 <= 1000.0) {
    bVar1 = Value::IsNan<double>(local_80);
    dVar7 = 0.0;
    if (!bVar1) {
      bVar1 = Value::IsNan<double>(local_40);
      if (bVar1) {
        dVar7 = 0.0;
      }
      else {
        bVar1 = Value::IsNan<double>(local_48);
        dVar7 = 0.0;
        if ((local_40 < local_80 && !bVar1) && (dVar7 = local_78, local_80 < local_48)) {
          dVar7 = ((local_80 - local_40) * local_78) / (local_48 - local_40);
        }
      }
    }
    local_80 = dVar7;
    bVar1 = Value::IsFinite<double>(dVar7);
    if (bVar1) {
      result->_M_string_length = 0;
      dVar7 = local_80 * 8.0;
      *(result->_M_dataplus)._M_p = '\0';
      uVar6 = (ulong)(long)dVar7 >> 3 & 0x1fffffff;
      uVar5 = uVar6;
      while (bVar1 = uVar5 != 0, uVar5 = uVar5 - 1, bVar1) {
        ::std::__cxx11::string::append((char *)result);
      }
      if (((long)dVar7 & 7U) != 0) {
        uVar6 = uVar6 + 1;
        ::std::__cxx11::string::append((char *)result);
      }
      uVar5 = (long)(local_78 - 9.223372036854776e+18) & (long)local_78 >> 0x3f | (long)local_78;
      lVar4 = uVar5 - uVar6;
      if (uVar6 <= uVar5 && lVar4 != 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_68,(char)lVar4);
        ::std::__cxx11::string::append((string *)result);
        ::std::__cxx11::string::~string((string *)&local_68);
      }
      string_t::string_t((string_t *)&local_38.pointer,result);
      return (anon_union_16_2_67f50693_for_value)
             (anon_union_16_2_67f50693_for_value)local_38.pointer;
    }
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_68,"Bar width must not be NaN or infinity",&local_81);
    OutOfRangeException::OutOfRangeException(pOVar3,&local_68);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_68,"Max bar width must be <= 1000",&local_81);
  OutOfRangeException::OutOfRangeException(pOVar3,&local_68);
  __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string_t BarScalarFunction(double x, double min, double max, double max_width, string &result) {
	static const char *FULL_BLOCK = UnicodeBar::FullBlock();
	static const char *const *PARTIAL_BLOCKS = UnicodeBar::PartialBlocks();
	static const idx_t PARTIAL_BLOCKS_COUNT = UnicodeBar::PartialBlocksCount();

	if (!Value::IsFinite(max_width)) {
		throw OutOfRangeException("Max bar width must not be NaN or infinity");
	}
	if (max_width < 1) {
		throw OutOfRangeException("Max bar width must be >= 1");
	}
	if (max_width > 1000) {
		throw OutOfRangeException("Max bar width must be <= 1000");
	}

	double width;

	if (Value::IsNan(x) || Value::IsNan(min) || Value::IsNan(max) || x <= min) {
		width = 0;
	} else if (x >= max) {
		width = max_width;
	} else {
		width = max_width * (x - min) / (max - min);
	}

	if (!Value::IsFinite(width)) {
		throw OutOfRangeException("Bar width must not be NaN or infinity");
	}

	result.clear();
	idx_t used_blocks = 0;

	auto width_as_int = LossyNumericCast<uint32_t>(width * PARTIAL_BLOCKS_COUNT);
	idx_t full_blocks_count = (width_as_int / PARTIAL_BLOCKS_COUNT);
	for (idx_t i = 0; i < full_blocks_count; i++) {
		used_blocks++;
		result += FULL_BLOCK;
	}

	idx_t remaining = width_as_int % PARTIAL_BLOCKS_COUNT;

	if (remaining) {
		used_blocks++;
		result += PARTIAL_BLOCKS[remaining];
	}

	const idx_t integer_max_width = (idx_t)max_width;
	if (used_blocks < integer_max_width) {
		result += std::string(integer_max_width - used_blocks, ' ');
	}
	return string_t(result);
}